

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moldudp.hh
# Opt level: O2

void __thiscall
helix::nasdaq::moldudp_session<helix::nasdaq::nordic_itch_handler>::register_callback
          (moldudp_session<helix::nasdaq::nordic_itch_handler> *this,event_callback *callback)

{
  function<void_(const_helix::event_&)> local_30;
  
  std::function<void_(const_helix::event_&)>::function(&local_30,callback);
  nordic_itch_handler::register_callback(&this->_handler,&local_30);
  std::_Function_base::~_Function_base(&local_30.super__Function_base);
  return;
}

Assistant:

void moldudp_session<Handler>::register_callback(event_callback callback)
{
    _handler.register_callback(callback);
}